

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file_dictionary_handler.c
# Opt level: O0

ion_err_t ffdict_find(ion_dictionary_t *dictionary,ion_predicate_t *predicate,
                     ion_dict_cursor_t **cursor)

{
  int iVar1;
  ion_flat_file_t *flat_file_00;
  ion_err_t iVar2;
  ion_dict_cursor_t *piVar3;
  ion_predicate_t *piVar4;
  void *pvVar5;
  void *pvVar6;
  undefined1 local_c8 [7];
  ion_err_t scan_result_2;
  ion_flat_file_row_t row_2;
  ion_fpos_t loc_2;
  ion_flat_file_cursor_t *flat_file_cursor_2;
  ion_flat_file_cursor_t *flat_file_cursor_1;
  undefined1 local_90 [7];
  ion_err_t scan_result_1;
  ion_flat_file_row_t row_1;
  ion_fpos_t loc_1;
  ion_flat_file_cursor_t *flat_file_cursor;
  undefined1 local_60 [7];
  ion_err_t scan_result;
  ion_flat_file_row_t row;
  ion_fpos_t loc;
  ion_key_t target_key;
  ion_key_size_t key_size;
  ion_flat_file_t *flat_file;
  ion_dict_cursor_t **cursor_local;
  ion_predicate_t *predicate_local;
  ion_dictionary_t *dictionary_local;
  
  piVar3 = (ion_dict_cursor_t *)malloc(0x30);
  *cursor = piVar3;
  flat_file_00 = (ion_flat_file_t *)dictionary->instance;
  if (*cursor == (ion_dict_cursor_t *)0x0) {
    dictionary_local._7_1_ = '\x06';
  }
  else {
    (*cursor)->dictionary = dictionary;
    (*cursor)->status = '\x03';
    (*cursor)->destroy = ffdict_destroy_cursor;
    (*cursor)->next = ffdict_next;
    piVar4 = (ion_predicate_t *)malloc(0x20);
    (*cursor)->predicate = piVar4;
    if ((*cursor)->predicate == (ion_predicate_t *)0x0) {
      free(*cursor);
      dictionary_local._7_1_ = '\x06';
    }
    else {
      (*cursor)->predicate->type = predicate->type;
      (*cursor)->predicate->destroy = predicate->destroy;
      iVar1 = (dictionary->instance->record).key_size;
      switch(predicate->type) {
      case '\0':
        pvVar6 = (predicate->statement).range.lower_bound;
        pvVar5 = malloc((long)iVar1);
        ((*cursor)->predicate->statement).range.lower_bound = pvVar5;
        if (((*cursor)->predicate->statement).range.lower_bound == (ion_key_t)0x0) {
          free((*cursor)->predicate);
          free(*cursor);
          dictionary_local._7_1_ = '\x06';
        }
        else {
          memcpy(((*cursor)->predicate->statement).range.lower_bound,pvVar6,(long)iVar1);
          row.value = (ion_value_t)0xffffffffffffffff;
          dictionary_local._7_1_ =
               flat_file_scan(flat_file_00,-1,(ion_fpos_t *)&row.value,
                              (ion_flat_file_row_t *)local_60,'\x01',flat_file_predicate_key_match,
                              pvVar6);
          if (dictionary_local._7_1_ == '\x0e') {
            (*cursor)->status = '\x01';
            dictionary_local._7_1_ = '\0';
          }
          else if (dictionary_local._7_1_ == '\0') {
            (*cursor)->status = '\x02';
            *(ion_value_t *)(*cursor + 1) = row.value;
            dictionary_local._7_1_ = '\0';
          }
        }
        break;
      case '\x01':
        pvVar6 = malloc((long)iVar1);
        ((*cursor)->predicate->statement).range.lower_bound = pvVar6;
        if (((*cursor)->predicate->statement).range.lower_bound == (ion_key_t)0x0) {
          free((*cursor)->predicate);
          free(*cursor);
          dictionary_local._7_1_ = '\x06';
        }
        else {
          memcpy(((*cursor)->predicate->statement).range.lower_bound,
                 (predicate->statement).range.lower_bound,(long)iVar1);
          pvVar6 = malloc((long)iVar1);
          ((*cursor)->predicate->statement).range.upper_bound = pvVar6;
          if (((*cursor)->predicate->statement).range.upper_bound == (ion_key_t)0x0) {
            free(((*cursor)->predicate->statement).range.lower_bound);
            free((*cursor)->predicate);
            free(*cursor);
            dictionary_local._7_1_ = '\x06';
          }
          else {
            memcpy(((*cursor)->predicate->statement).range.upper_bound,
                   (predicate->statement).range.upper_bound,(long)iVar1);
            row_1.value = (ion_value_t)0xffffffffffffffff;
            dictionary_local._7_1_ =
                 flat_file_scan(flat_file_00,-1,(ion_fpos_t *)&row_1.value,
                                (ion_flat_file_row_t *)local_90,'\x01',
                                flat_file_predicate_within_bounds,
                                ((*cursor)->predicate->statement).range.lower_bound,
                                ((*cursor)->predicate->statement).range.upper_bound);
            if (dictionary_local._7_1_ == '\x0e') {
              (*cursor)->status = '\x01';
              dictionary_local._7_1_ = '\0';
            }
            else if (dictionary_local._7_1_ == '\0') {
              (*cursor)->status = '\x02';
              *(ion_value_t *)(*cursor + 1) = row_1.value;
              dictionary_local._7_1_ = '\0';
            }
          }
        }
        break;
      case '\x02':
        piVar3 = *cursor;
        row_2.value = (ion_value_t)0xffffffffffffffff;
        iVar2 = flat_file_scan(flat_file_00,-1,(ion_fpos_t *)&row_2.value,
                               (ion_flat_file_row_t *)local_c8,'\x01',flat_file_predicate_not_empty)
        ;
        if (iVar2 == '\x0e') {
          (*cursor)->status = '\x01';
        }
        else {
          if (iVar2 != '\0') {
            return iVar2;
          }
          *(ion_value_t *)(piVar3 + 1) = row_2.value;
          (*cursor)->status = '\x02';
        }
        dictionary_local._7_1_ = '\0';
        break;
      case '\x03':
        dictionary_local._7_1_ = '\0';
        break;
      default:
        dictionary_local._7_1_ = '\x05';
      }
    }
  }
  return dictionary_local._7_1_;
}

Assistant:

ion_err_t
ffdict_find(
	ion_dictionary_t	*dictionary,
	ion_predicate_t		*predicate,
	ion_dict_cursor_t	**cursor
) {
	*cursor = malloc(sizeof(ion_flat_file_cursor_t));

	ion_flat_file_t *flat_file = (ion_flat_file_t *) dictionary->instance;

	if (NULL == *cursor) {
		return err_out_of_memory;
	}

	(*cursor)->dictionary	= dictionary;
	(*cursor)->status		= cs_cursor_uninitialized;

	(*cursor)->destroy		= ffdict_destroy_cursor;
	(*cursor)->next			= ffdict_next;

	(*cursor)->predicate	= malloc(sizeof(ion_predicate_t));

	if (NULL == (*cursor)->predicate) {
		free(*cursor);
		return err_out_of_memory;
	}

	(*cursor)->predicate->type		= predicate->type;
	(*cursor)->predicate->destroy	= predicate->destroy;

	ion_key_size_t key_size = dictionary->instance->record.key_size;

	switch (predicate->type) {
		case predicate_equality: {
			ion_key_t target_key = predicate->statement.equality.equality_value;

			(*cursor)->predicate->statement.equality.equality_value = malloc(key_size);

			if (NULL == (*cursor)->predicate->statement.equality.equality_value) {
				free((*cursor)->predicate);
				free(*cursor);
				return err_out_of_memory;
			}

			memcpy((*cursor)->predicate->statement.equality.equality_value, target_key, key_size);

			ion_fpos_t			loc			= -1;
			ion_flat_file_row_t row;
			ion_err_t			scan_result = flat_file_scan(flat_file, -1, &loc, &row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_key_match, target_key);

			if (err_file_hit_eof == scan_result) {
				/* If this happens, that means the target key doesn't exist */
				(*cursor)->status = cs_end_of_results;
				return err_ok;
			}
			else if (err_ok == scan_result) {
				(*cursor)->status = cs_cursor_initialized;

				ion_flat_file_cursor_t *flat_file_cursor = (ion_flat_file_cursor_t *) (*cursor);

				flat_file_cursor->current_location = loc;
				return err_ok;
			}
			else {
				/* File scan hit an error condition */
				return scan_result;
			}

			break;
		}

		case predicate_range: {
			(*cursor)->predicate->statement.range.lower_bound = malloc(key_size);

			if (NULL == (*cursor)->predicate->statement.range.lower_bound) {
				free((*cursor)->predicate);
				free(*cursor);
				return err_out_of_memory;
			}

			memcpy((*cursor)->predicate->statement.range.lower_bound, predicate->statement.range.lower_bound, key_size);

			(*cursor)->predicate->statement.range.upper_bound = malloc(key_size);

			if (NULL == (*cursor)->predicate->statement.range.upper_bound) {
				free((*cursor)->predicate->statement.range.lower_bound);
				free((*cursor)->predicate);
				free(*cursor);
				return err_out_of_memory;
			}

			memcpy((*cursor)->predicate->statement.range.upper_bound, predicate->statement.range.upper_bound, key_size);

			/* Find the first satisfactory key. */
			ion_fpos_t			loc			= -1;
			ion_flat_file_row_t row;
			ion_err_t			scan_result = flat_file_scan(flat_file, -1, &loc, &row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_within_bounds, (*cursor)->predicate->statement.range.lower_bound, (*cursor)->predicate->statement.range.upper_bound);

			if (err_file_hit_eof == scan_result) {
				/* This means the returned node is smaller than the lower bound, which means that there are no valid records to return */
				(*cursor)->status = cs_end_of_results;
				return err_ok;
			}
			else if (err_ok == scan_result) {
				(*cursor)->status = cs_cursor_initialized;

				ion_flat_file_cursor_t *flat_file_cursor = (ion_flat_file_cursor_t *) (*cursor);

				flat_file_cursor->current_location = loc;
				return err_ok;
			}
			else {
				/* Scan failed due to external error */
				return scan_result;
			}

			break;
		}

		case predicate_all_records: {
			ion_flat_file_cursor_t *flat_file_cursor	= (ion_flat_file_cursor_t *) (*cursor);

			ion_fpos_t			loc						= -1;
			ion_flat_file_row_t row;
			ion_err_t			scan_result				= flat_file_scan(flat_file, -1, &loc, &row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_not_empty);

			if (err_file_hit_eof == scan_result) {
				(*cursor)->status = cs_end_of_results;
			}
			else if (err_ok == scan_result) {
				flat_file_cursor->current_location	= loc;
				(*cursor)->status					= cs_cursor_initialized;
			}
			else {
				/* Scan failure */
				return scan_result;
			}

			return err_ok;
			break;
		}

		case predicate_predicate: {
			break;
		}

		default: {
			return err_invalid_predicate;
			break;
		}
	}

	return err_ok;
}